

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::GenDefaultConstant_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field)

{
  bool bVar1;
  string local_40;
  FieldDef *local_20;
  FieldDef *field_local;
  CppGenerator *this_local;
  
  local_20 = field;
  field_local = (FieldDef *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  bVar1 = IsFloat((field->value).type.base_type);
  if (bVar1) {
    FloatConstantGenerator::GenFloatConstant_abi_cxx11_
              (__return_storage_ptr__,&(this->float_const_gen_).super_FloatConstantGenerator,
               local_20);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,(string *)&(local_20->value).constant);
    NumToStringCpp(__return_storage_ptr__,&local_40,(local_20->value).type.base_type);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultConstant(const FieldDef &field) {
    if (IsFloat(field.value.type.base_type))
      return float_const_gen_.GenFloatConstant(field);
    else
      return NumToStringCpp(field.value.constant, field.value.type.base_type);
  }